

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_CreateAnd(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *p1;
  undefined4 local_24;
  Hop_Obj_t *pHStack_20;
  int i;
  Hop_Obj_t *pFunc;
  int nVars_local;
  Hop_Man_t *p_local;
  
  pHStack_20 = Hop_ManConst1(p);
  for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
    p1 = Hop_IthVar(p,local_24);
    pHStack_20 = Hop_And(p,pHStack_20,p1);
  }
  return pHStack_20;
}

Assistant:

Hop_Obj_t * Hop_CreateAnd( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst1( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_And( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}